

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<8,_0,_13,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  Matrix<float,_4,_4> *mat;
  Matrix<float,_4,_4> *mat_00;
  VecAccess<float,_4,_3> local_158;
  Mat4 local_140;
  Matrix<float,_4,_4> local_100;
  Vector<float,_3> local_c0 [2];
  Matrix<float,_4,_4> local_a8;
  Matrix<float,_4,_4> local_68;
  Vector<float,_3> local_28;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *evalCtx_local;
  
  local_10 = evalCtx;
  getInputValue<0,13>((Mat4 *)&local_a8,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  decrement<float,4,4>(&local_68,(MatrixCaseUtils *)&local_a8,mat);
  reduceToVec3((MatrixCaseUtils *)&local_28,&local_68);
  getInputValue<0,13>(&local_140,(MatrixCaseUtils *)local_10,(ShaderEvalContext *)0x0,in_ECX);
  decrement<float,4,4>(&local_100,(MatrixCaseUtils *)&local_140,mat_00);
  reduceToVec3((MatrixCaseUtils *)local_c0,&local_100);
  tcu::operator+((tcu *)&local_1c,&local_28,local_c0);
  tcu::Vector<float,_4>::xyz(&local_158,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_158,&local_1c);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_100);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_140);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_68);
  tcu::Matrix<float,_4,_4>::~Matrix(&local_a8);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0))) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}